

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void nc_compute_weights(int n,double x_min,double x_max,double *x,double *w)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  
  lVar12 = (long)n;
  uVar9 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar9 = lVar12 * 8;
  }
  iVar6 = 0;
  if (0 < n) {
    iVar6 = n;
  }
  pvVar1 = operator_new__(uVar9);
  for (uVar9 = 1; uVar9 != iVar6 + 1; uVar9 = uVar9 + 1) {
    for (lVar5 = 0; (ulong)(n + 1) - 1 != lVar5; lVar5 = lVar5 + 1) {
      *(undefined8 *)((long)pvVar1 + lVar5 * 8) = 0;
    }
    *(undefined8 *)((long)pvVar1 + uVar9 * 8 + -8) = 0x3ff0000000000000;
    pdVar7 = x + lVar12 + -2;
    for (uVar10 = 2; pdVar8 = pdVar7, uVar11 = uVar10, iVar2 = n, uVar10 != n + 1;
        uVar10 = uVar10 + 1) {
      for (; (long)uVar11 <= lVar12; uVar11 = uVar11 + 1) {
        lVar5 = (long)(iVar2 + -1);
        *(double *)((long)pvVar1 + lVar5 * 8) =
             (*(double *)((long)pvVar1 + (long)iVar2 * 8 + -0x10) -
             *(double *)((long)pvVar1 + lVar5 * 8)) / (*pdVar8 - x[lVar5]);
        pdVar8 = pdVar8 + -1;
        iVar2 = iVar2 + -1;
      }
      pdVar7 = pdVar7 + -1;
    }
    pdVar7 = x + -2;
    for (uVar10 = 1; uVar10 != (uint)n; uVar10 = uVar10 + 1) {
      uVar11 = lVar12 * 8;
      for (lVar5 = 1; lVar5 <= (long)(lVar12 - uVar10); lVar5 = lVar5 + 1) {
        *(double *)((long)pvVar1 + (uVar11 - 0x10)) =
             *(double *)((long)pvVar1 + (uVar11 - 0x10)) -
             *(double *)((long)pdVar7 + uVar11) * *(double *)((long)pvVar1 + (uVar11 - 8));
        uVar11 = uVar11 - 8;
      }
      pdVar7 = pdVar7 + -1;
    }
    dVar13 = *(double *)((long)pvVar1 + lVar12 * 8 + -8) / (double)n;
    dVar14 = dVar13;
    for (uVar3 = n - 2U; uVar4 = n - 2U, -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      dVar14 = dVar14 * x_min +
               *(double *)((long)pvVar1 + (ulong)uVar3 * 8) / (double)(int)(uVar3 + 1);
    }
    for (; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      dVar13 = dVar13 * x_max +
               *(double *)((long)pvVar1 + (ulong)uVar4 * 8) / (double)(int)(uVar4 + 1);
    }
    w[uVar9 - 1] = dVar13 * x_max - dVar14 * x_min;
  }
  operator_delete__(pvVar1);
  return;
}

Assistant:

void nc_compute_weights ( int n, double x_min, double x_max, double x[], 
  double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    NC_COMPUTE_WEIGHTS computes weights for a Newton-Cotes quadrature rule.
//
//  Discussion:
//
//    For the interval [X_MIN,X_MAX], the Newton-Cotes quadrature rule 
//    estimates
//
//      Integral ( X_MIN <= X <= X_MAX ) F(X) dX
//
//    using N abscissas X and weights W:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) ).
//
//    For the CLOSED rule, the abscissas include the end points.
//    For the OPEN rule, the abscissas do not include the end points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    20 June 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double X_MIN, X_MAX, the endpoints of the interval.
//
//    Input, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *d;
  int i;
  int j;
  int k;
  double yvala;
  double yvalb;

  d = new double[n];

  for ( i = 1; i <= n; i++ )
  {
//
//  Compute the Lagrange basis polynomial which is 1 at XTAB(I),
//  and zero at the other nodes.
//
    for ( j = 1; j <= n; j++ )
    {
      d[j-1] = 0.0;
    }
    d[i-1] = 1.0;

    for ( j = 2; j <= n; j++ )
    {
      for ( k = j; k <= n; k++ )
      {
        d[n+j-k-1] = ( d[n+j-k-2] - d[n+j-k-1] ) / ( x[n-k] - x[n+j-k-1] );
      }
    }
    for ( j = 1; j <= n - 1; j++ )
    {
      for ( k = 1; k <= n - j; k++ )
      {
        d[n-k-1] = d[n-k-1] - x[n-k-j] * d[n-k];
      }
    }
//
//  Evaluate the antiderivative of the polynomial at the left and
//  right endpoints.
//
    yvala = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      yvala = yvala * x_min + d[j] / double( j + 1 );
    }
    yvala = yvala * x_min;

    yvalb = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      yvalb = yvalb * x_max + d[j] / double( j + 1 );
    }
    yvalb = yvalb * x_max;

    w[i-1] = yvalb - yvala;
  }

  delete [] d;

  return;
}